

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O1

void __thiscall
google::protobuf::util::FieldMaskUtil::MergeMessageTo
          (FieldMaskUtil *this,Message *source,FieldMask *mask,MergeOptions *options,
          Message *destination)

{
  long lVar1;
  long lVar2;
  LogMessage *other;
  _Link_type __x;
  LogMessage local_a8;
  undefined1 local_70 [8];
  FieldMaskTree tree;
  
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)source;
  lVar1 = (**(code **)(*(long *)this + 0x98))();
  lVar2 = (**(code **)(*(long *)options + 0x98))(options);
  if (lVar1 != lVar2) {
    protobuf::internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/field_mask_util.cc"
               ,0x2b0);
    other = protobuf::internal::LogMessage::operator<<
                      (&local_a8,
                       "CHECK failed: source.GetDescriptor() == destination->GetDescriptor(): ");
    protobuf::internal::LogFinisher::operator=((LogFinisher *)local_70,other);
    protobuf::internal::LogMessage::~LogMessage(&local_a8);
  }
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tree;
  tree.root_.children._M_t._M_impl._0_4_ = 0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  __x = (_Link_type)tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_node_count;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  anon_unknown_0::FieldMaskTree::MergeFromFieldMask
            ((FieldMaskTree *)local_70,
             (FieldMask *)tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
    anon_unknown_0::FieldMaskTree::MergeMessage
              ((FieldMaskTree *)local_70,(Node *)this,&mask->super_Message,options,destination);
    __x = (_Link_type)this;
  }
  anon_unknown_0::FieldMaskTree::Node::ClearChildren((Node *)local_70);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
              *)tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,__x);
  return;
}

Assistant:

void FieldMaskUtil::MergeMessageTo(const Message& source, const FieldMask& mask,
                                   const MergeOptions& options,
                                   Message* destination) {
  GOOGLE_CHECK(source.GetDescriptor() == destination->GetDescriptor());
  // Build a FieldMaskTree and walk through the tree to merge all specified
  // fields.
  FieldMaskTree tree;
  tree.MergeFromFieldMask(mask);
  tree.MergeMessage(source, options, destination);
}